

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

int util_scan_files(char *dir,char ***result)

{
  dirent *pdVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  char *__dest;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  char **filelist;
  dirent **files;
  ulong local_f0;
  ulong local_e8;
  size_t capacity;
  char ***local_d8;
  char *local_d0;
  char **subdirs;
  stat stat_buf;
  
  iVar3 = stat(dir,(stat *)&stat_buf);
  iVar5 = -1;
  if ((iVar3 != -1) && ((stat_buf.st_mode & 0xf000) == 0x4000)) {
    uVar4 = scandir(dir,(dirent ***)&files,util_scan_files_comp,alphasort);
    if ((int)uVar4 < 0) {
LAB_001046b6:
      iVar5 = -1;
    }
    else {
      filelist = (char **)0x0;
      capacity = 0;
      iVar3 = util_vec_ensure(&filelist,&capacity,8,8);
      iVar5 = -1;
      if (iVar3 == 0) {
        uVar11 = (ulong)uVar4;
        local_f0 = 0;
        lVar12 = 0;
        local_e8 = uVar11;
        local_d8 = result;
        local_d0 = dir;
        while (local_f0 != uVar11) {
          pdVar1 = files[local_f0];
          pcVar8 = pdVar1->d_name;
          sVar6 = strlen(dir);
          sVar7 = strlen(pcVar8);
          __dest = (char *)malloc(sVar6 + sVar7 + 3);
          strcpy(__dest,dir);
          if (dir[sVar6 - 1] != '/') {
            sVar6 = strlen(__dest);
            (__dest + sVar6)[0] = '/';
            (__dest + sVar6)[1] = '\0';
          }
          strcat(__dest,pcVar8);
          iVar5 = stat(__dest,(stat *)&stat_buf);
          uVar10 = local_f0;
          lVar9 = lVar12;
          if (iVar5 == -1) {
            free(files[local_f0]);
            free(__dest);
          }
          else if ((stat_buf.st_mode & 0xf000) == 0x4000) {
            sVar6 = strlen(pcVar8);
            if (pdVar1->d_name[sVar6 - 1] != '/') {
              sVar6 = strlen(__dest);
              (__dest + sVar6)[0] = '/';
              (__dest + sVar6)[1] = '\0';
            }
            uVar4 = util_scan_files(__dest,&subdirs);
            ppcVar2 = subdirs;
            if ((int)uVar4 < 1) {
              uVar4 = 0;
            }
            lVar13 = 2;
            while (lVar13 - (ulong)uVar4 != 2) {
              sVar6 = strlen(ppcVar2[lVar13 + -2]);
              pcVar8 = (char *)malloc(sVar6 + 1);
              filelist[lVar9] = pcVar8;
              lVar12 = lVar9 + 1;
              strcpy(pcVar8,ppcVar2[lVar13 + -2]);
              free(ppcVar2[lVar13 + -2]);
              iVar5 = util_vec_ensure(&filelist,&capacity,lVar9 + 2,8);
              lVar13 = lVar13 + 1;
              lVar9 = lVar12;
              if (iVar5 != 0) goto LAB_00104690;
            }
            free(ppcVar2);
            uVar10 = local_f0;
            free(files[local_f0]);
            free(__dest);
            uVar11 = local_e8;
            dir = local_d0;
          }
          else {
            lVar9 = lVar12 + 1;
            filelist[lVar12] = __dest;
            iVar5 = util_vec_ensure(&filelist,&capacity,lVar12 + 2,8);
            uVar10 = local_f0;
            lVar12 = lVar9;
            if (iVar5 != 0) {
LAB_00104690:
              ppcVar2 = filelist;
              if (filelist != (char **)0x0) {
                while (lVar12 = lVar12 + -1, lVar12 != -1) {
                  free(ppcVar2[lVar12]);
                }
                free(ppcVar2);
              }
              goto LAB_001046b6;
            }
            free(files[local_f0]);
            uVar11 = local_e8;
          }
          lVar12 = lVar9;
          local_f0 = uVar10 + 1;
        }
        *local_d8 = filelist;
        iVar5 = (int)lVar12;
      }
    }
  }
  return iVar5;
}

Assistant:

int
util_scan_files(
    const char* dir,
    char*** result)
{
    struct stat stat_buf;
    if (stat(dir, &stat_buf) == -1)
        return -1;
    // We can only scan directories
    if (!S_ISDIR(stat_buf.st_mode))
        return -1;

    struct dirent **files;
    int n;
    n = scandir(dir, &files, util_scan_files_comp, alphasort);
    if (n < 0)
        return -1;

    char** filelist = NULL;
    size_t size = 0, capacity = 0;
    if (util_vec_ensure(&filelist, &capacity, 8, sizeof(char*)))
        return -1;
    for (int i = 0; i < n; ++i) {
        const char* name = files[i]->d_name;
        char* fullpath = malloc(strlen(dir)+strlen(name)+3);
        strcpy(fullpath, dir);
        if (dir[strlen(dir)-1] != '/') strcat(fullpath, "/");
        strcat(fullpath, name);
        if (stat(fullpath, &stat_buf) == -1) {
            free(files[i]);
            free(fullpath);
            continue;
        }
        if (S_ISDIR(stat_buf.st_mode)) {
            char** subdirs;
            if (name[strlen(name)-1] != '/') strcat(fullpath, "/");
            int new_cnt = util_scan_files(fullpath, &subdirs);
            for (int j = 0; j < new_cnt; j++) {
                filelist[size] = malloc(strlen(subdirs[j])+1);
                strcpy(filelist[size++], subdirs[j]);
                free(subdirs[j]);

                if (util_vec_ensure(&filelist, &capacity, size+1, sizeof(char*)))
                    goto err;
            }
            free(subdirs);
            free(files[i]);
            free(fullpath);
            continue;
        }
        filelist[size++] = fullpath;
        if (util_vec_ensure(&filelist, &capacity, size+1, sizeof(char*)))
            goto err;
        free(files[i]);
    }
    *result = filelist;
    return size;
err:
    if (filelist) {
        while (size--)
            free(filelist[size]);
        free(filelist);
    }
    return -1;
}